

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deviceinfo.cc
# Opt level: O2

void __thiscall rcdiscover::DeviceInfo::DeviceInfo(DeviceInfo *this,string *iface_name)

{
  std::__cxx11::string::string((string *)this,(string *)iface_name);
  (this->manufacturer_name)._M_dataplus._M_p = (pointer)&(this->manufacturer_name).field_2;
  (this->manufacturer_name)._M_string_length = 0;
  (this->manufacturer_name).field_2._M_local_buf[0] = '\0';
  (this->model_name)._M_dataplus._M_p = (pointer)&(this->model_name).field_2;
  (this->model_name)._M_string_length = 0;
  (this->model_name).field_2._M_local_buf[0] = '\0';
  (this->device_version)._M_dataplus._M_p = (pointer)&(this->device_version).field_2;
  (this->device_version)._M_string_length = 0;
  (this->device_version).field_2._M_local_buf[0] = '\0';
  (this->manufacturer_info)._M_dataplus._M_p = (pointer)&(this->manufacturer_info).field_2;
  (this->manufacturer_info)._M_string_length = 0;
  (this->manufacturer_info).field_2._M_local_buf[0] = '\0';
  (this->serial_number)._M_dataplus._M_p = (pointer)&(this->serial_number).field_2;
  (this->serial_number)._M_string_length = 0;
  (this->serial_number).field_2._M_local_buf[0] = '\0';
  (this->user_name)._M_dataplus._M_p = (pointer)&(this->user_name).field_2;
  (this->user_name)._M_string_length = 0;
  (this->user_name).field_2._M_local_buf[0] = '\0';
  clear(this);
  return;
}

Assistant:

DeviceInfo::DeviceInfo(std::string iface_name) :
    iface_name(std::move(iface_name))
{
  clear();
}